

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O1

void __thiscall LASindex::print(LASindex *this)

{
  LASinterval *pLVar1;
  BOOL BVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  
  LASinterval::get_cells(this->interval);
  BVar2 = LASinterval::has_cells(this->interval);
  if (BVar2) {
    uVar8 = 0;
    uVar4 = 0;
    uVar3 = 0;
    uVar6 = 0;
    do {
      BVar2 = LASinterval::has_intervals(this->interval);
      uVar5 = 0;
      uVar7 = 0;
      if (BVar2) {
        uVar7 = 0;
        uVar5 = 0;
        do {
          pLVar1 = this->interval;
          uVar5 = ((uVar5 + pLVar1->end) - pLVar1->start) + 1;
          uVar7 = uVar7 + 1;
          BVar2 = LASinterval::has_intervals(pLVar1);
        } while (BVar2);
      }
      if (uVar5 != this->interval->total) {
        LASMessage(LAS_VERBOSE,"total_check %d != interval->total %d",(ulong)uVar5);
      }
      pLVar1 = this->interval;
      LASMessage(LAS_VERY_VERBOSE,"cell %d intervals %d full %d total %d (%.2f)",
                 (double)(((float)pLVar1->full * 100.0) / (float)pLVar1->total),
                 (ulong)(uint)pLVar1->index,(ulong)uVar7);
      pLVar1 = this->interval;
      uVar3 = uVar3 + pLVar1->full;
      uVar6 = uVar6 + 1;
      uVar4 = uVar4 + pLVar1->total;
      uVar8 = uVar8 + uVar7;
      BVar2 = LASinterval::has_cells(pLVar1);
    } while (BVar2);
    fVar9 = (float)uVar4;
  }
  else {
    fVar9 = 0.0;
    uVar6 = 0;
    uVar3 = 0;
    uVar8 = 0;
  }
  LASMessage(LAS_VERY_VERBOSE,"total cells/intervals %d/%d full %d (%.2f)",
             (double)(((float)uVar3 * 100.0) / fVar9),(ulong)uVar6,(ulong)uVar8,(ulong)uVar3);
  return;
}

Assistant:

void LASindex::print()
{
  U32 total_cells = 0;
  U32 total_full = 0;
  U32 total_total = 0;
  U32 total_intervals = 0;
  U32 total_check;
  U32 intervals;
  interval->get_cells();
  while (interval->has_cells())
  {
    total_check = 0;
    intervals = 0;
    while (interval->has_intervals())
    {
      total_check += interval->end-interval->start+1;
      intervals++;
    }
    if (total_check != interval->total)
    {
      LASMessage(LAS_VERBOSE, "total_check %d != interval->total %d", total_check, interval->total);
    }
    LASMessage(LAS_VERY_VERBOSE, "cell %d intervals %d full %d total %d (%.2f)", interval->index, intervals, interval->full, interval->total, 100.0f*interval->full/interval->total);
    total_cells++;
    total_full += interval->full;
    total_total += interval->total;
    total_intervals += intervals;
  }
  LASMessage(LAS_VERY_VERBOSE, "total cells/intervals %d/%d full %d (%.2f)", total_cells, total_intervals, total_full, 100.0f*total_full/total_total);
}